

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O3

void Nwk_ManDelayTraceSortPins(Nwk_Obj_t *pNode,int *pPinPerm,float *pPinDelays)

{
  ulong uVar1;
  int iVar2;
  Nwk_Obj_t **ppNVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  Nwk_Obj_t *pNVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  
  uVar4 = pNode->nFanins;
  uVar5 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    ppNVar3 = pNode->pFanio;
    pNVar9 = *ppNVar3;
    if (pNVar9 != (Nwk_Obj_t *)0x0) {
      lVar11 = 0;
      do {
        pPinPerm[lVar11] = (int)lVar11;
        pPinDelays[lVar11] = pNVar9->tArrival;
        uVar5 = (ulong)pNode->nFanins;
        if ((long)uVar5 <= lVar11 + 1) break;
        pNVar9 = ppNVar3[lVar11 + 1];
        lVar11 = lVar11 + 1;
      } while (pNVar9 != (Nwk_Obj_t *)0x0);
    }
    uVar4 = (uint)uVar5;
    if (1 < (int)uVar4) {
      uVar6 = 1;
      uVar10 = 0;
      do {
        uVar1 = uVar10 + 1;
        if ((long)uVar1 < (long)(int)uVar5) {
          uVar8 = uVar10 & 0xffffffff;
          uVar12 = uVar6;
          do {
            uVar7 = uVar12 & 0xffffffff;
            if (pPinDelays[pPinPerm[uVar12]] < pPinDelays[pPinPerm[(int)uVar8]] ||
                pPinDelays[pPinPerm[uVar12]] == pPinDelays[pPinPerm[(int)uVar8]]) {
              uVar7 = uVar8;
            }
            uVar12 = uVar12 + 1;
            uVar4 = (uint)uVar7;
            uVar8 = uVar7;
          } while ((uVar5 & 0xffffffff) != uVar12);
        }
        else {
          uVar4 = (uint)uVar10;
        }
        if (uVar10 != uVar4) {
          iVar2 = pPinPerm[uVar10];
          pPinPerm[uVar10] = pPinPerm[(int)uVar4];
          pPinPerm[(int)uVar4] = iVar2;
          uVar5 = (ulong)(uint)pNode->nFanins;
        }
        uVar4 = (uint)uVar5;
        uVar6 = uVar6 + 1;
        uVar10 = uVar1;
      } while ((long)uVar1 < (long)(int)(uVar4 - 1));
    }
  }
  if (uVar4 != 0) {
    if ((int)uVar4 <= *pPinPerm) {
      __assert_fail("Nwk_ObjFaninNum(pNode) == 0 || pPinPerm[0] < Nwk_ObjFaninNum(pNode)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                    ,0x5c,"void Nwk_ManDelayTraceSortPins(Nwk_Obj_t *, int *, float *)");
    }
    if (1 < (int)uVar4) {
      uVar5 = 1;
      do {
        if ((int)uVar4 <= pPinPerm[uVar5]) {
          __assert_fail("pPinPerm[i] < Nwk_ObjFaninNum(pNode)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                        ,0x5f,"void Nwk_ManDelayTraceSortPins(Nwk_Obj_t *, int *, float *)");
        }
        if (pPinDelays[pPinPerm[uVar5 - 1]] < pPinDelays[pPinPerm[uVar5]]) {
          __assert_fail("pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]]",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                        ,0x60,"void Nwk_ManDelayTraceSortPins(Nwk_Obj_t *, int *, float *)");
        }
        uVar5 = uVar5 + 1;
      } while (uVar4 != uVar5);
    }
  }
  return;
}

Assistant:

void Nwk_ManDelayTraceSortPins( Nwk_Obj_t * pNode, int * pPinPerm, float * pPinDelays )
{
    Nwk_Obj_t * pFanin;
    int i, j, best_i, temp;
    // start the trivial permutation and collect pin delays
    Nwk_ObjForEachFanin( pNode, pFanin, i )
    {
        pPinPerm[i] = i;
        pPinDelays[i] = Nwk_ObjArrival(pFanin);
    }
    // selection sort the pins in the decreasible order of delays
    // this order will match the increasing order of LUT input pins
    for ( i = 0; i < Nwk_ObjFaninNum(pNode)-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < Nwk_ObjFaninNum(pNode); j++ )
            if ( pPinDelays[pPinPerm[j]] > pPinDelays[pPinPerm[best_i]] )
                best_i = j;
        if ( best_i == i )
            continue;
        temp = pPinPerm[i]; 
        pPinPerm[i] = pPinPerm[best_i]; 
        pPinPerm[best_i] = temp;
    }
    // verify
    assert( Nwk_ObjFaninNum(pNode) == 0 || pPinPerm[0] < Nwk_ObjFaninNum(pNode) );
    for ( i = 1; i < Nwk_ObjFaninNum(pNode); i++ )
    {
        assert( pPinPerm[i] < Nwk_ObjFaninNum(pNode) );
        assert( pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]] );
    }
}